

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leds.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  uint8_t power_led;
  uchar local_1cc;
  bool enable_spot_led;
  bool enable_dock_led;
  bool enable_debris_led;
  bool enable_check_robot_led;
  char local_1c7;
  uchar local_1c6;
  uchar local_1c5;
  char digit_buffer [5];
  int baud;
  RobotModel model;
  string port;
  Create robot;
  
  std::__cxx11::string::string((string *)&port,"/dev/ttyUSB0",(allocator *)&robot);
  pcVar6 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)&robot,argv[1],(allocator *)digit_buffer);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &robot,"create1");
    std::__cxx11::string::~string((string *)&robot);
    if (bVar1) {
      pcVar6 = "Running driver for Create 1";
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  create::Create::Create(&robot,1);
  cVar2 = create::Create::connect((string *)&robot,(int *)&port);
  if (cVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    poVar4 = std::operator<<(poVar4,port._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar4);
    create::Create::~Create(&robot);
    std::__cxx11::string::~string((string *)&port);
    return 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::endl<char,std::char_traits<char>>(poVar4);
  digit_buffer[0] = '\x03';
  digit_buffer[1] = '\0';
  digit_buffer[2] = '\0';
  digit_buffer[3] = '\0';
  create::Create::setMode((CreateMode *)&robot);
  enable_check_robot_led = true;
  enable_debris_led = false;
  enable_dock_led = true;
  enable_spot_led = false;
  power_led = '\0';
  do {
    create::Create::enableCheckRobotLED((bool *)&robot);
    create::Create::enableDebrisLED((bool *)&robot);
    create::Create::enableDockLED((bool *)&robot);
    create::Create::enableSpotLED((bool *)&robot);
    local_1cc = 0xff;
    create::Create::setPowerLED((uchar *)&robot,&power_led);
    iVar3 = sprintf(digit_buffer,"%d",(ulong)power_led);
    for (lVar5 = (long)iVar3; lVar5 < 4; lVar5 = lVar5 + 1) {
      digit_buffer[lVar5] = ' ';
    }
    local_1cc = digit_buffer[0];
    local_1c5 = digit_buffer[1];
    local_1c6 = digit_buffer[2];
    local_1c7 = digit_buffer[3];
    create::Create::setDigitsASCII((uchar *)&robot,&local_1cc,&local_1c5,&local_1c6);
    enable_check_robot_led = (bool)(enable_check_robot_led ^ 1);
    enable_debris_led = (bool)(enable_debris_led ^ 1);
    enable_dock_led = (bool)(enable_dock_led ^ 1);
    enable_spot_led = (bool)(enable_spot_led ^ 1);
    power_led = power_led + '\x01';
    usleep(250000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  bool enable_check_robot_led = true;
  bool enable_debris_led = false;
  bool enable_dock_led = true;
  bool enable_spot_led = false;
  uint8_t power_led = 0;
  char digit_buffer[5];

  while (true) {
    // Set LEDs
    robot.enableCheckRobotLED(enable_check_robot_led);
    robot.enableDebrisLED(enable_debris_led);
    robot.enableDockLED(enable_dock_led);
    robot.enableSpotLED(enable_spot_led);
    robot.setPowerLED(power_led);

    // Set 7-segment displays
    const int len = sprintf(digit_buffer, "%d", power_led);
    for (int i = len; i < 4; i++) digit_buffer[i] = ' ';
    robot.setDigitsASCII(digit_buffer[0], digit_buffer[1], digit_buffer[2], digit_buffer[3]);

    // Update LED values
    enable_check_robot_led = !enable_check_robot_led;
    enable_debris_led = !enable_debris_led;
    enable_dock_led = !enable_dock_led;
    enable_spot_led = !enable_spot_led;
    power_led++;

    usleep(250000);  // 5 Hz
  }

  return 0;
}